

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O3

void dumpData<int>(Serializer *serializer,DataFieldInfo *info,Savepoint *savepoint,Bounds *iBounds,
                  Bounds *jBounds,Bounds *kBounds,Bounds *lBounds)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  int *data;
  int local_a0;
  int *local_38;
  
  readData<int>(serializer,info,savepoint,&local_38);
  iVar4 = iBounds->lower;
  if (iBounds->lower < 1) {
    iVar4 = 0;
  }
  iVar1 = info->jSize_;
  iVar11 = info->iSize_ + -1;
  if (iBounds->upper < iVar11) {
    iVar11 = iBounds->upper;
  }
  iVar12 = jBounds->lower;
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  iVar9 = iVar1 + -1;
  if (jBounds->upper < iVar1 + -1) {
    iVar9 = jBounds->upper;
  }
  if (iVar4 <= iVar11) {
    iVar2 = info->kSize_;
    iVar3 = info->lSize_;
    iVar5 = iVar3 + -1;
    if (lBounds->upper < iVar3 + -1) {
      iVar5 = lBounds->upper;
    }
    uVar6 = lBounds->lower;
    if (lBounds->lower < 1) {
      uVar6 = 0;
    }
    iVar7 = iVar2 + -1;
    if (kBounds->upper < iVar2 + -1) {
      iVar7 = kBounds->upper;
    }
    uVar8 = 0;
    if (0 < kBounds->lower) {
      uVar8 = kBounds->lower;
    }
    iVar13 = ((iVar1 * iVar4 + iVar12) * iVar2 + uVar8) * iVar3;
    do {
      iVar14 = iVar13;
      iVar10 = iVar12;
      if (iVar12 <= iVar9) {
        do {
          if (1 < iVar2) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ ",2);
          }
          uVar15 = (ulong)uVar8;
          local_a0 = iVar14;
          if ((int)uVar8 <= iVar7) {
            do {
              if (1 < iVar3) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"( ",2);
              }
              if ((int)uVar6 <= iVar5) {
                uVar16 = (ulong)uVar6;
                do {
                  std::ostream::operator<<((ostream *)&std::cout,local_38[(long)local_a0 + uVar16]);
                  if ((long)uVar16 < (long)iVar5) {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2)
                    ;
                  }
                  uVar16 = uVar16 + 1;
                } while (iVar5 + 1 != uVar16);
              }
              if (1 < iVar3) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," )",2);
              }
              if ((long)uVar15 < (long)iVar7) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
              }
              uVar15 = uVar15 + 1;
              local_a0 = local_a0 + iVar3;
            } while (uVar15 != iVar7 + 1);
          }
          if (1 < iVar2) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ]",2);
          }
          if (iVar10 < iVar9) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
          }
          iVar14 = iVar14 + iVar2 * iVar3;
          bVar17 = iVar10 != iVar9;
          iVar10 = iVar10 + 1;
        } while (bVar17);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      std::ostream::flush();
      iVar13 = iVar13 + iVar1 * iVar2 * iVar3;
      bVar17 = iVar4 < iVar11;
      iVar4 = iVar4 + 1;
    } while (bVar17);
  }
  return;
}

Assistant:

void dumpData(const Serializer& serializer, const DataFieldInfo& info, const Savepoint& savepoint,
              const Bounds& iBounds, const Bounds& jBounds, const Bounds& kBounds, const Bounds& lBounds)
{
	T* data;
	readData(serializer, info, savepoint, data);

	int iSize = info.iSize();
	int iLower = std::max(0, iBounds.lower);
	int iUpper = std::min(iSize - 1, iBounds.upper);
	int jSize = info.jSize();
	int jLower = std::max(0, jBounds.lower);
	int jUpper = std::min(jSize - 1, jBounds.upper);
	int kSize = info.kSize();
	int kLower = std::max(0, kBounds.lower);
	int kUpper = std::min(kSize - 1, kBounds.upper);
	int lSize = info.lSize();
	int lLower = std::max(0, lBounds.lower);
	int lUpper = std::min(lSize - 1, lBounds.upper);

	for (int i = iLower; i <= iUpper; ++i)
	{
		for (int j = jLower; j <= jUpper; ++j)
		{
			if (kSize > 1) std::cout << "[ ";
			for (int k = kLower; k <= kUpper; ++k)
			{
				if (lSize > 1) std::cout << "( ";
				for (int l = lLower; l <= lUpper; ++l)
				{
					int index = i * jSize * kSize * lSize + j * kSize * lSize + k * lSize + l;
					std::cout << data[index];
					if (l < lUpper) std::cout << ", ";
				}
				if (lSize > 1) std::cout << " )";
				if (k < kUpper) std::cout << ", ";
			}
			if (kSize > 1) std::cout << " ]";
			if (j < jUpper) std::cout << ", ";
		}
		std::cout << std::endl;
	}
}